

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encoded_uint_vector.h
# Opt level: O1

uint __thiscall
s2coding::EncodedUintVector<unsigned_int>::operator[](EncodedUintVector<unsigned_int> *this,int i)

{
  byte bVar1;
  uint uVar2;
  long lVar3;
  S2LogMessage SStack_18;
  
  if ((i < 0) || (this->size_ <= (uint)i)) {
    S2LogMessage::S2LogMessage
              (&SStack_18,
               "/workspace/llm4binary/github/license_all_cmakelists_25/figroc[P]s2geometry/src/s2/encoded_uint_vector.h"
               ,0xf6,kFatal,(ostream *)&std::cerr);
    std::__ostream_insert<char,std::char_traits<char>>
              (SStack_18.stream_,"Check failed: i >= 0 && i < size_ ",0x22);
  }
  else {
    bVar1 = this->len_;
    if ((ulong)bVar1 < 5) {
      if (bVar1 == 4) {
        uVar2 = *(uint *)(this->data_ + i * (uint)bVar1);
      }
      else {
        lVar3 = (long)(this->data_ + i * (uint)bVar1) + (ulong)bVar1;
        uVar2 = 0;
        if ((bVar1 & 2) != 0) {
          uVar2 = (uint)*(ushort *)(lVar3 + -2);
          lVar3 = lVar3 + -2;
        }
        if ((bVar1 & 1) != 0) {
          uVar2 = uVar2 << 8 | (uint)*(byte *)(lVar3 + -1);
        }
      }
      return uVar2;
    }
    S2LogMessage::S2LogMessage
              (&SStack_18,
               "/workspace/llm4binary/github/license_all_cmakelists_25/figroc[P]s2geometry/src/s2/encoded_uint_vector.h"
               ,0x93,kFatal,(ostream *)&std::cerr);
    std::__ostream_insert<char,std::char_traits<char>>
              (SStack_18.stream_,"Check failed: length >= 0 && length <= sizeof(T) ",0x31);
  }
  abort();
}

Assistant:

inline T EncodedUintVector<T>::operator[](int i) const {
  S2_DCHECK(i >= 0 && i < size_);
  return GetUintWithLength<T>(data_ + i * len_, len_);
}